

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O2

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  ExpressionList *this_00;
  Block *block;
  size_t sVar1;
  pointer pEVar2;
  Expression *pEVar3;
  bool bVar4;
  bool bVar5;
  Expression **ppEVar6;
  Index i;
  Index index;
  EffectAnalyzer *effects;
  undefined1 other [8];
  uint index_00;
  uint uVar7;
  undefined1 local_268 [8];
  EffectAnalyzer blockChildEffects;
  ChildIterator iterator;
  Expression *child;
  anon_class_24_3_515ba06b continueEarly;
  undefined1 local_90 [8];
  Iterator __begin3;
  undefined1 auStack_78 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Block *local_58;
  Expression *local_50;
  Expression *back;
  ArenaVector<wasm::Expression_*> *local_40;
  ExpressionList *__range4;
  
  if ((0x31 < (ulong)curr->_id) || ((0x200000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)) {
    auStack_78 = (undefined1  [8])0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __begin3.index = (size_t)curr;
    back = (Expression *)this;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)
               &blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               curr);
    uVar7 = 0xffffffff;
    for (index = 0;
        (int)((ulong)((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                           _M_elems[3]) >> 3) +
        (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        index; index = index + 1) {
      ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::getChild
                          ((AbstractChildIterator<wasm::ChildIterator> *)
                           &blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,index);
      if ((*ppEVar6)->_id == BlockId) {
        uVar7 = index;
      }
    }
    if (uVar7 != 0xffffffff) {
      if (uVar7 != 0) {
        std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                  ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78
                   ,(ulong)uVar7);
      }
      local_58 = (Block *)0x0;
      for (index_00 = 0; index_00 <= uVar7; index_00 = index_00 + 1) {
        ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::getChild
                            ((AbstractChildIterator<wasm::ChildIterator> *)
                             &blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,index_00);
        block = (Block *)*ppEVar6;
        child = (Expression *)auStack_78;
        continueEarly.childEffects =
             (vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)back;
        continueEarly.this =
             (MergeBlocks *)
             ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data + 0x10);
        iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)block;
        if ((((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
              BlockId) && ((block->name).super_IString.str._M_str == (char *)0x0)) &&
           (1 < (block->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements)) {
          bVar4 = hasUnreachableChild(block);
          if (bVar4) goto LAB_008bf1ca;
          this_00 = &block->list;
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          local_50 = *ppEVar6;
          if ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
              (local_50->type).id) {
            __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
            continueEarly.child =
                 (Expression **)
                 (block->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
            bVar4 = false;
            local_90 = (undefined1  [8])this_00;
            local_40 = this_00;
            __range4._4_4_ = uVar7;
            while ((__begin3.parent != (ArenaVector<wasm::Expression_*> *)continueEarly.child ||
                   (local_90 != (undefined1  [8])local_40))) {
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        Iterator::operator*((Iterator *)local_90);
              if (*ppEVar6 == local_50) break;
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)local_268,(PassOptions *)((back->type).id + 0x30),
                         *(Module **)(back + 0x10),*ppEVar6);
              pEVar2 = childEffects.
                       super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              other = auStack_78;
              do {
                if (other == (undefined1  [8])pEVar2) goto LAB_008bf295;
                bVar5 = EffectAnalyzer::invalidates
                                  ((EffectAnalyzer *)local_268,(EffectAnalyzer *)other);
                other = (undefined1  [8])((long)other + 0x170);
              } while (!bVar5);
              bVar4 = true;
LAB_008bf295:
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_268);
              if (bVar4) break;
              __begin3.parent =
                   (ArenaVector<wasm::Expression_*> *)
                   ((long)&((__begin3.parent)->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ).data + 1);
            }
            uVar7 = __range4._4_4_;
            if (bVar4) {
              visitExpression::anon_class_24_3_515ba06b::operator()
                        ((anon_class_24_3_515ba06b *)&child);
              uVar7 = __range4._4_4_;
            }
            else {
              if (local_58 == (Block *)0x0) {
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                          (&local_40->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
                local_58 = block;
              }
              else {
                local_268 = (undefined1  [8])local_40;
                blockChildEffects.ignoreImplicitTraps = false;
                blockChildEffects.trapsNeverHappen = false;
                blockChildEffects._2_6_ = 0;
                sVar1 = (block->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements;
                while ((blockChildEffects._0_8_ != sVar1 || (local_268 != (undefined1  [8])local_40)
                       )) {
                  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            Iterator::operator*((Iterator *)local_268);
                  if (*ppEVar6 == local_50) break;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (&(local_58->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,*ppEVar6);
                  blockChildEffects._0_8_ = blockChildEffects._0_8_ + 1;
                }
              }
              pEVar3 = local_50;
              ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::getChild
                                  ((AbstractChildIterator<wasm::ChildIterator> *)
                                   &blockChildEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count,index_00);
              *ppEVar6 = pEVar3;
              if (index_00 < uVar7) {
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           auStack_78,(PassOptions *)((back->type).id + 0x30),
                           *(Module **)(back + 0x10),&local_50);
              }
            }
          }
          else {
            visitExpression::anon_class_24_3_515ba06b::operator()
                      ((anon_class_24_3_515ba06b *)&child);
          }
        }
        else {
LAB_008bf1ca:
          visitExpression::anon_class_24_3_515ba06b::operator()((anon_class_24_3_515ba06b *)&child);
        }
      }
      if (local_58 != (Block *)0x0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(local_58->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)__begin3.index);
        Block::finalize(local_58,(Type)*(uintptr_t *)(__begin3.index + 8));
        Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
        replaceCurrent((Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        *)(back + 3),(Expression *)local_58);
      }
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
               (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems +
               3));
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1 ||
          hasUnreachableChild(block)) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
    }
  }